

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.h
# Opt level: O0

int * __thiscall soplex::DataSet<int>::create(DataSet<int> *this,DataKey *newkey)

{
  int iVar1;
  DataKey *newkey_local;
  DataSet<int> *this_local;
  
  if (this->firstfree == -1 - this->themax) {
    iVar1 = this->thesize;
    this->thesize = iVar1 + 1;
    newkey->idx = iVar1;
  }
  else {
    newkey->idx = -1 - this->firstfree;
    this->firstfree = this->theitem[newkey->idx].info;
  }
  this->thekey[this->thenum] = *newkey;
  this->theitem[newkey->idx].info = this->thenum;
  this->thenum = this->thenum + 1;
  return &this->theitem[newkey->idx].data;
}

Assistant:

DATA* create(DataKey& newkey)
   {
      assert(num() < max());

      if(firstfree != -themax - 1)
      {
         newkey.idx = -firstfree - 1;
         firstfree = theitem[newkey.idx].info;
      }
      else
         newkey.idx = thesize++;

      thekey[thenum] = newkey;
      theitem[newkey.idx].info = thenum;
      ++thenum;

      return &(theitem[newkey.idx].data);
   }